

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

void http_mime_parser_on_partial_data(http_mime_parser_s *parser,void *value,size_t value_len)

{
  long lVar1;
  size_t value_len_local;
  void *value_local;
  http_mime_parser_s *parser_local;
  
  lVar1._0_1_ = parser[2].in_obj;
  lVar1._1_1_ = parser[2].done;
  lVar1._2_1_ = parser[2].error;
  lVar1._3_5_ = *(undefined5 *)&parser[2].field_0x13;
  if (lVar1 == 0) {
    *(size_t *)&parser[2].in_obj = (long)value + (parser[2].boundary_len - (long)parser[2].boundary)
    ;
  }
  parser[3].boundary = parser[3].boundary + value_len;
  return;
}

Assistant:

static void http_mime_parser_on_partial_data(http_mime_parser_s *parser,
                                             void *value, size_t value_len) {
  if (!http_mime_parser2fio(parser)->partial_offset)
    http_mime_parser2fio(parser)->partial_offset =
        http_mime_parser2fio(parser)->pos +
        ((uintptr_t)value -
         (uintptr_t)http_mime_parser2fio(parser)->buffer.data);
  http_mime_parser2fio(parser)->partial_length += value_len;
  (void)value;
}